

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::GetFreeEntry(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
               *this)

{
  HeapAllocator *alloc;
  EntryType *pEVar1;
  undefined1 local_30 [8];
  TrackAllocData data;
  
  pEVar1 = this->free;
  if (pEVar1 != (EntryType *)0x0) {
    this->free = pEVar1->next;
    this->freecount = this->freecount - 1;
    return pEVar1;
  }
  local_30 = (undefined1  [8])&SimpleHashEntry<Js::JavascriptPromise*,int>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2792d81;
  data.filename._0_4_ = 0x14a;
  alloc = Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_30);
  pEVar1 = (EntryType *)new<Memory::HeapAllocator>(0x18,alloc,0x2ff150);
  return pEVar1;
}

Assistant:

EntryType* GetFreeEntry()
    {
        EntryType* retFree = free;
        if (nullptr == retFree )
        {
            retFree = AllocatorNewStruct(TAllocator, allocator, EntryType);
        }
        else
        {
            free = retFree->next;
            freecount--;
        }
        return retFree;
    }